

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Tjen::Node::editStack(Node *this,string *newTop)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  int i;
  ulong uVar3;
  char t;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = std::operator==(newTop,anon_var_dwarf_52127);
  if (bVar1) {
    std::deque<char,_std::allocator<char>_>::pop_back(&(this->stack).c);
    return;
  }
  uVar2 = newTop->_M_string_length;
  if (1 < uVar2) {
    for (uVar3 = 0; uVar3 < uVar2 - 1; uVar3 = uVar3 + 1) {
      uStack_28 = CONCAT17(*(newTop->_M_dataplus)._M_p,(undefined7)uStack_28);
      std::deque<char,_std::allocator<char>_>::push_back
                (&(this->stack).c,(value_type *)((long)&uStack_28 + 7));
      uVar2 = newTop->_M_string_length;
    }
  }
  return;
}

Assistant:

void Tjen::Node::editStack( const std::string &newTop) {
    if(newTop == "ε"){
        stack.pop();

    }else if(newTop.size() >= 2){
        for (int i = 0; i < newTop.size()-1; ++i) {
            char t = newTop[0];
            stack.push(t);
        }

    }
}